

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

int http_sendfile2(http_s *h,char *prefix,size_t prefix_len,char *encoded,size_t encoded_len)

{
  void *pvVar1;
  byte bVar2;
  fio_str_info_s n;
  fio_str_info_s v;
  bool bVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  FIOBJ FVar7;
  FIOBJ FVar8;
  fiobj_object_vtable_s *pfVar9;
  size_t sVar10;
  FIOBJ FVar11;
  ulong uVar12;
  int64_t iVar13;
  long lVar14;
  size_t __n;
  ulong uVar15;
  byte bVar16;
  long lVar17;
  byte bVar18;
  char *pcVar19;
  int *piVar20;
  ulong uVar21;
  char cVar22;
  void *pvVar24;
  bool bVar25;
  fio_str_info_s s;
  fio_str_info_s ac_str;
  fio_str_info_s ret_7;
  fio_str_info_s ret_11;
  fio_str_info_s ret_9;
  stat file_data;
  fio_str_info_s local_198;
  fio_str_info_s local_178;
  fio_str_info_s local_158;
  fio_str_info_s local_138;
  fio_str_info_s local_118;
  FIOBJ local_100;
  ulong local_f8 [3];
  char *local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  char *local_c8;
  stat local_c0;
  uint uVar23;
  
  if (h == (http_s *)0x0) {
    return -1;
  }
  if (((h->method == 0) && (h->status_str == 0)) && (h->status != 0)) {
    return -1;
  }
  memset(&local_c0,0,0x90);
  if (http_sendfile2::accept_enc_hash == 0) {
    http_sendfile2::accept_enc_hash = fio_siphash13("accept-encoding",0xf,0x1456f2,0x145bc9);
  }
  if (http_sendfile2::range_hash == 0) {
    http_sendfile2::range_hash = fio_siphash13("range",5,0x1456f2,0x145bc9);
  }
  FVar7 = fiobj_str_tmp();
  if (prefix_len != 0 && prefix != (char *)0x0) {
    if ((encoded != (char *)0x0) && (prefix[prefix_len - 1] == '/')) {
      prefix_len = prefix_len - (*encoded == '/');
    }
    fiobj_str_capa_assert(FVar7,encoded_len + prefix_len + 4);
    fiobj_str_write(FVar7,prefix,prefix_len);
  }
  cVar22 = (char)FVar7;
  uVar23 = (uint)FVar7;
  lVar17 = (long)FVar7 >> 1;
  if (FVar7 == 0) {
LAB_0014808e:
    local_198.data = anon_var_dwarf_20c;
    uVar6 = 4;
    goto LAB_001480a1;
  }
  if ((FVar7 & 1) == 0) {
    switch(uVar23 & 6) {
    case 0:
      cVar4 = *(char *)(FVar7 & 0xfffffffffffffff8);
LAB_00148004:
      switch(cVar4) {
      case '\'':
        pfVar9 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case '(':
        goto switchD_00147ff9_caseD_2;
      case ')':
        pfVar9 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case '*':
        goto switchD_00147ff9_caseD_4;
      case '+':
        pfVar9 = &FIOBJECT_VTABLE_DATA;
        break;
      default:
        pfVar9 = &FIOBJECT_VTABLE_NUMBER;
      }
      break;
    case 2:
switchD_00147ff9_caseD_2:
      pfVar9 = &FIOBJECT_VTABLE_STRING;
      break;
    case 4:
switchD_00147ff9_caseD_4:
      pfVar9 = &FIOBJECT_VTABLE_HASH;
      break;
    case 6:
      if (cVar22 == '&') {
        local_198.data = anon_var_dwarf_217;
        uVar6 = 5;
      }
      else {
        if ((uVar23 & 0xff) != 0x16) {
          cVar4 = cVar22;
          if ((uVar23 & 0xff) == 6) goto LAB_0014808e;
          goto LAB_00148004;
        }
        local_198.data = anon_var_dwarf_222;
        uVar6 = 4;
      }
LAB_001480a1:
      local_198.capa = 0;
      local_198.len = (size_t)uVar6;
      goto LAB_001480a6;
    }
    (*pfVar9->to_str)(&local_198,FVar7);
  }
  else {
    fio_ltocstr(&local_198,lVar17);
  }
LAB_001480a6:
  sVar10 = local_198.len;
  piVar20 = (int *)local_198.data;
  if (encoded != (char *)0x0) {
    if (0 < (long)encoded_len) {
      pcVar19 = encoded + encoded_len;
      do {
        cVar4 = *encoded;
        if (cVar4 == '%') {
          bVar2 = encoded[1];
          bVar16 = bVar2 - 0x30;
          if (9 < bVar16) {
            if (0x25 < bVar2 - 0x41) {
              return -1;
            }
            if ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) == 0) {
              return -1;
            }
            bVar16 = bVar2 + 0xa9;
          }
          *(byte *)((long)local_198.data + local_198.len) = bVar16 << 4;
          bVar2 = encoded[2];
          bVar18 = bVar2 - 0x30;
          if (9 < bVar18) {
            if (0x25 < bVar2 - 0x41) {
              return -1;
            }
            if ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) == 0) {
              return -1;
            }
            bVar18 = (bVar2 | 0x20) + 0xa9;
          }
          *(byte *)((long)local_198.data + local_198.len) = bVar18 | bVar16 << 4;
          encoded = encoded + 3;
        }
        else {
          encoded = encoded + 1;
          *(char *)((long)local_198.data + local_198.len) = cVar4;
        }
        local_198.len = local_198.len + 1;
      } while (encoded < pcVar19);
    }
    *(undefined1 *)((long)local_198.data + local_198.len) = 0;
    fiobj_str_resize(FVar7,local_198.len);
    piVar20 = (int *)local_198.data;
    sVar10 = local_198.len;
    __n = local_198.len - prefix_len;
    if (0 < (long)__n) {
      pvVar1 = (void *)((long)local_198.data + local_198.len);
      pvVar24 = (void *)(prefix_len + (long)local_198.data);
      do {
        pvVar24 = memchr(pvVar24,0x2f,__n);
        if (pvVar24 == (void *)0x0) break;
        if ((*(char *)((long)pvVar24 + 1) == '/') ||
           (((__n = (long)pvVar1 - (long)pvVar24, 3 < __n && (*(char *)((long)pvVar24 + 1) == '.'))
            && ((*(char *)((long)pvVar24 + 2) == '.' && (*(char *)((long)pvVar24 + 3) == '/')))))) {
          return -1;
        }
        pvVar24 = (void *)((long)pvVar24 + 1);
      } while (pvVar24 < pvVar1);
    }
  }
  if (*(char *)((long)piVar20 + (sVar10 - 1)) == '/') {
    fiobj_str_write(FVar7,"index.html",10);
  }
  if (FVar7 == 0) {
LAB_001482cb:
    local_198.data = anon_var_dwarf_20c;
    uVar6 = 4;
    goto LAB_001482de;
  }
  if ((FVar7 & 1) == 0) {
    switch(uVar23 & 6) {
    case 0:
      cVar4 = *(char *)(FVar7 & 0xfffffffffffffff8);
LAB_0014824b:
      switch(cVar4) {
      case '\'':
        pfVar9 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case '(':
        goto switchD_00148240_caseD_2;
      case ')':
        pfVar9 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case '*':
        goto switchD_00148240_caseD_4;
      case '+':
        pfVar9 = &FIOBJECT_VTABLE_DATA;
        break;
      default:
        pfVar9 = &FIOBJECT_VTABLE_NUMBER;
      }
      break;
    case 2:
switchD_00148240_caseD_2:
      pfVar9 = &FIOBJECT_VTABLE_STRING;
      break;
    case 4:
switchD_00148240_caseD_4:
      pfVar9 = &FIOBJECT_VTABLE_HASH;
      break;
    case 6:
      if (cVar22 == '&') {
        local_198.data = anon_var_dwarf_217;
        uVar6 = 5;
      }
      else {
        if ((uVar23 & 0xff) != 0x16) {
          cVar4 = cVar22;
          if ((uVar23 & 0xff) == 6) goto LAB_001482cb;
          goto LAB_0014824b;
        }
        local_198.data = anon_var_dwarf_222;
        uVar6 = 4;
      }
LAB_001482de:
      local_198.capa = 0;
      local_198.len = (size_t)uVar6;
      goto LAB_001482e3;
    }
    (*pfVar9->to_str)(&local_198,FVar7);
  }
  else {
    fio_ltocstr(&local_198,lVar17);
  }
LAB_001482e3:
  FVar8 = fiobj_hash_get2(h->headers,http_sendfile2::accept_enc_hash);
  if (FVar8 == 0) {
LAB_001485d8:
    iVar5 = stat(local_198.data,&local_c0);
    if (iVar5 != 0) {
      return -1;
    }
    bVar3 = true;
    if ((local_c0.st_mode & 0xd000 | 0x2000) != 0xa000) {
      return -1;
    }
  }
  else {
    cVar4 = (char)FVar8;
    if ((FVar8 & 1) == 0) {
      switch((uint)FVar8 & 6) {
      case 0:
        cVar4 = *(char *)(FVar8 & 0xfffffffffffffff8);
LAB_00148323:
        switch(cVar4) {
        case '\'':
          pfVar9 = &FIOBJECT_VTABLE_FLOAT;
          break;
        case '(':
          goto switchD_00148318_caseD_2;
        case ')':
          pfVar9 = &FIOBJECT_VTABLE_ARRAY;
          break;
        case '*':
          goto switchD_00148318_caseD_4;
        case '+':
          pfVar9 = &FIOBJECT_VTABLE_DATA;
          break;
        default:
          pfVar9 = &FIOBJECT_VTABLE_NUMBER;
        }
        break;
      case 2:
switchD_00148318_caseD_2:
        pfVar9 = &FIOBJECT_VTABLE_STRING;
        break;
      case 4:
switchD_00148318_caseD_4:
        pfVar9 = &FIOBJECT_VTABLE_HASH;
        break;
      case 6:
        if (cVar4 == '&') {
          local_178.data = anon_var_dwarf_217;
          local_178.len._0_4_ = 5;
        }
        else {
          uVar6 = (uint)FVar8 & 0xff;
          if (uVar6 == 0x16) {
            local_178.data = anon_var_dwarf_222;
            local_178.len._0_4_ = 4;
          }
          else {
            if (uVar6 != 6) goto LAB_00148323;
            local_178.data = anon_var_dwarf_20c;
            local_178.len._0_4_ = 4;
          }
        }
        local_178.len._4_4_ = 0;
        local_178.capa._4_4_ = 0;
        local_178.capa._0_4_ = 0;
        goto LAB_00148378;
      }
      (*pfVar9->to_str)(&local_178,FVar8);
    }
    else {
      fio_ltocstr(&local_178,(long)FVar8 >> 1);
    }
LAB_00148378:
    if ((((int *)local_178.data == (int *)0x0) ||
        (pcVar19 = strstr(local_178.data,"gzip"), pcVar19 == (char *)0x0)) ||
       ((*(char *)((long)local_198.data + (local_198.len - 3)) == '.' &&
        ((*(char *)((long)local_198.data + (local_198.len - 2)) == 'g' &&
         (*(char *)((long)local_198.data + (local_198.len - 1)) == 'z')))))) goto LAB_001485d8;
    fiobj_str_write(FVar7,".gz",3);
    if (FVar7 == 0) {
LAB_0014857a:
      local_158.data = anon_var_dwarf_20c;
      local_158.len._0_4_ = 4;
      goto LAB_00148590;
    }
    if ((FVar7 & 1) == 0) {
      switch(uVar23 & 6) {
      case 0:
        cVar4 = *(char *)(FVar7 & 0xfffffffffffffff8);
LAB_00148404:
        switch(cVar4) {
        case '\'':
          pfVar9 = &FIOBJECT_VTABLE_FLOAT;
          break;
        case '(':
          goto switchD_001483f9_caseD_2;
        case ')':
          pfVar9 = &FIOBJECT_VTABLE_ARRAY;
          break;
        case '*':
          goto switchD_001483f9_caseD_4;
        case '+':
          pfVar9 = &FIOBJECT_VTABLE_DATA;
          break;
        default:
          pfVar9 = &FIOBJECT_VTABLE_NUMBER;
        }
        break;
      case 2:
switchD_001483f9_caseD_2:
        pfVar9 = &FIOBJECT_VTABLE_STRING;
        break;
      case 4:
switchD_001483f9_caseD_4:
        pfVar9 = &FIOBJECT_VTABLE_HASH;
        break;
      case 6:
        if (cVar22 == '&') {
          local_158.data = anon_var_dwarf_217;
          local_158.len._0_4_ = 5;
        }
        else {
          if ((uVar23 & 0xff) != 0x16) {
            cVar4 = cVar22;
            if ((uVar23 & 0xff) == 6) goto LAB_0014857a;
            goto LAB_00148404;
          }
          local_158.data = anon_var_dwarf_222;
          local_158.len._0_4_ = 4;
        }
LAB_00148590:
        local_158.capa = 0;
        local_158.len._4_4_ = 0;
        goto LAB_00148598;
      }
      (*pfVar9->to_str)(&local_158,FVar7);
    }
    else {
      fio_ltocstr(&local_158,lVar17);
    }
LAB_00148598:
    local_198.data = local_158.data;
    local_198.len = CONCAT44(local_158.len._4_4_,(undefined4)local_158.len);
    local_198.capa = local_158.capa;
    iVar5 = stat(local_158.data,&local_c0);
    if ((iVar5 != 0) || ((local_c0.st_mode & 0xd000 | 0x2000) != 0xa000)) {
      fiobj_str_resize(FVar7,local_198.len - 3);
      goto LAB_001485d8;
    }
    bVar3 = false;
  }
  FVar8 = fiobj_str_buf(0x20);
  if (FVar8 == 0) {
LAB_001486f8:
    local_118.data = anon_var_dwarf_20c;
    local_118.len._0_4_ = 4;
    goto LAB_0014870e;
  }
  cVar4 = (char)FVar8;
  if ((FVar8 & 1) == 0) {
    switch((uint)FVar8 & 6) {
    case 0:
      cVar4 = *(char *)(FVar8 & 0xfffffffffffffff8);
LAB_00148651:
      switch(cVar4) {
      case '\'':
        pfVar9 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case '(':
        goto switchD_00148646_caseD_2;
      case ')':
        pfVar9 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case '*':
        goto switchD_00148646_caseD_4;
      case '+':
        pfVar9 = &FIOBJECT_VTABLE_DATA;
        break;
      default:
        pfVar9 = &FIOBJECT_VTABLE_NUMBER;
      }
      break;
    case 2:
switchD_00148646_caseD_2:
      pfVar9 = &FIOBJECT_VTABLE_STRING;
      break;
    case 4:
switchD_00148646_caseD_4:
      pfVar9 = &FIOBJECT_VTABLE_HASH;
      break;
    case 6:
      if (cVar4 == '&') {
        local_118.data = anon_var_dwarf_217;
        local_118.len._0_4_ = 5;
      }
      else {
        uVar6 = (uint)FVar8 & 0xff;
        if (uVar6 != 0x16) {
          if (uVar6 == 6) goto LAB_001486f8;
          goto LAB_00148651;
        }
        local_118.data = anon_var_dwarf_222;
        local_118.len._0_4_ = 4;
      }
LAB_0014870e:
      local_118.capa._0_4_ = 0;
      local_118.capa._4_4_ = 0;
      local_118.len._4_4_ = 0;
      goto LAB_00148716;
    }
    (*pfVar9->to_str)(&local_118,FVar8);
  }
  else {
    fio_ltocstr(&local_118,(long)FVar8 >> 1);
  }
LAB_00148716:
  uVar21 = local_c0.st_mtim.tv_sec;
  sVar10 = http_time2str(local_118.data,local_c0.st_mtim.tv_sec);
  fiobj_str_resize(FVar8,sVar10);
  http_set_header(h,HTTP_HEADER_LAST_MODIFIED,FVar8);
  FVar11 = HTTP_HVALUE_MAX_AGE;
  FVar8 = HTTP_HEADER_CACHE_CONTROL;
  if ((((~(uint)HTTP_HVALUE_MAX_AGE & 6) != 0) && (HTTP_HVALUE_MAX_AGE != 0)) &&
     ((HTTP_HVALUE_MAX_AGE & 1) == 0)) {
    LOCK();
    piVar20 = (int *)((HTTP_HVALUE_MAX_AGE & 0xfffffffffffffff8) + 4);
    *piVar20 = *piVar20 + 1;
    UNLOCK();
    uVar21 = local_c0.st_mtim.tv_sec;
  }
  http_set_header(h,FVar8,FVar11);
  local_f8[0] = uVar21 ^ local_c0.st_size;
  local_f8[0] = fio_siphash13(local_f8,8,0x1456f2,0x145bc9);
  FVar8 = fiobj_str_buf(0x20);
  if (FVar8 == 0) {
LAB_00148882:
    local_138.data = anon_var_dwarf_20c;
    local_138.len._0_4_ = 4;
    goto LAB_00148898;
  }
  cVar4 = (char)FVar8;
  if ((FVar8 & 1) == 0) {
    switch((uint)FVar8 & 6) {
    case 0:
      cVar4 = *(char *)(FVar8 & 0xfffffffffffffff8);
LAB_00148806:
      switch(cVar4) {
      case '\'':
        pfVar9 = &FIOBJECT_VTABLE_FLOAT;
        break;
      case '(':
        goto switchD_001487fb_caseD_2;
      case ')':
        pfVar9 = &FIOBJECT_VTABLE_ARRAY;
        break;
      case '*':
        goto switchD_001487fb_caseD_4;
      case '+':
        pfVar9 = &FIOBJECT_VTABLE_DATA;
        break;
      default:
        pfVar9 = &FIOBJECT_VTABLE_NUMBER;
      }
      break;
    case 2:
switchD_001487fb_caseD_2:
      pfVar9 = &FIOBJECT_VTABLE_STRING;
      break;
    case 4:
switchD_001487fb_caseD_4:
      pfVar9 = &FIOBJECT_VTABLE_HASH;
      break;
    case 6:
      if (cVar4 == '&') {
        local_138.data = anon_var_dwarf_217;
        local_138.len._0_4_ = 5;
      }
      else {
        uVar6 = (uint)FVar8 & 0xff;
        if (uVar6 != 0x16) {
          if (uVar6 == 6) goto LAB_00148882;
          goto LAB_00148806;
        }
        local_138.data = anon_var_dwarf_222;
        local_138.len._0_4_ = 4;
      }
LAB_00148898:
      local_138.capa._0_4_ = 0;
      local_138.capa._4_4_ = 0;
      local_138.len._4_4_ = 0;
      goto LAB_001488a0;
    }
    (*pfVar9->to_str)(&local_138,FVar8);
  }
  else {
    fio_ltocstr(&local_138,(long)FVar8 >> 1);
  }
LAB_001488a0:
  iVar5 = fio_base64_encode(local_138.data,(char *)local_f8,8);
  fiobj_str_resize(FVar8,(long)iVar5);
  http_set_header(h,HTTP_HEADER_ETAG,FVar8);
  if (http_sendfile2::none_match_hash == 0) {
    http_sendfile2::none_match_hash = fio_siphash13("if-none-match",0xd,0x1456f2,0x145bc9);
  }
  FVar11 = fiobj_hash_get2(h->headers,http_sendfile2::none_match_hash);
  if ((FVar11 != 0) && (iVar5 = fiobj_iseq(FVar11,FVar8), iVar5 != 0)) {
    h->status = 0x130;
    goto LAB_0014893e;
  }
  if (http_sendfile2::ifrange_hash == 0) {
    http_sendfile2::ifrange_hash = fio_siphash13("if-range",8,0x1456f2,0x145bc9);
  }
  FVar11 = fiobj_hash_get2(h->headers,http_sendfile2::ifrange_hash);
  uVar21 = local_c0.st_size;
  if ((FVar11 == 0) || (iVar5 = fiobj_iseq(FVar11,FVar8), iVar5 == 0)) {
    uVar12 = fiobj_hash_get2(h->headers,http_sendfile2::range_hash);
    if (uVar12 == 0) {
      uVar12 = 0;
      goto LAB_00148a71;
    }
    if ((~(uint)uVar12 & 6) != 0 && (uVar12 & 1) == 0) {
      if (*(char *)(uVar12 & 0xfffffffffffffff8) == ')') {
        uVar12 = fiobj_ary_index(uVar12,0);
      }
      if (uVar12 != 0) goto LAB_00148a12;
LAB_00148d3d:
      local_178.data = anon_var_dwarf_20c;
      local_178.len._0_4_ = 4;
      goto LAB_00148d50;
    }
LAB_00148a12:
    if ((uVar12 & 1) == 0) {
      uVar6 = (uint)uVar12;
      switch(uVar6 & 6) {
      case 0:
        uVar6 = (uint)*(byte *)(uVar12 & 0xfffffffffffffff8);
LAB_00148a38:
        switch(uVar6 & 0xff) {
        case 0x27:
          pfVar9 = &FIOBJECT_VTABLE_FLOAT;
          break;
        case 0x28:
          goto switchD_00148a2d_caseD_2;
        case 0x29:
          pfVar9 = &FIOBJECT_VTABLE_ARRAY;
          break;
        case 0x2a:
          goto switchD_00148a2d_caseD_4;
        case 0x2b:
          pfVar9 = &FIOBJECT_VTABLE_DATA;
          break;
        default:
          pfVar9 = &FIOBJECT_VTABLE_NUMBER;
        }
        break;
      case 2:
switchD_00148a2d_caseD_2:
        pfVar9 = &FIOBJECT_VTABLE_STRING;
        break;
      case 4:
switchD_00148a2d_caseD_4:
        pfVar9 = &FIOBJECT_VTABLE_HASH;
        break;
      case 6:
        if ((char)uVar12 == '&') {
          local_178.data = anon_var_dwarf_217;
          local_178.len._0_4_ = 5;
        }
        else {
          if ((uVar6 & 0xff) != 0x16) {
            if ((uVar6 & 0xff) == 6) goto LAB_00148d3d;
            goto LAB_00148a38;
          }
          local_178.data = anon_var_dwarf_222;
          local_178.len._0_4_ = 4;
        }
LAB_00148d50:
        local_178.capa._0_4_ = 0;
        local_178.capa._4_4_ = 0;
        local_178.len._4_4_ = 0;
        goto LAB_00148d55;
      }
      (*pfVar9->to_str)(&local_178,uVar12);
    }
    else {
      fio_ltocstr(&local_178,(long)uVar12 >> 1);
    }
LAB_00148d55:
    if (((int *)local_178.data != (int *)0x0) &&
       ((short)*(int *)((long)local_178.data + 4) == 0x3d73 && *(int *)local_178.data == 0x65747962)
       ) {
      local_158.capa = (long)local_178.data + 6;
      uVar15 = fio_atol((char **)&local_158);
      if (local_c0.st_size - uVar15 != 0 && (long)uVar15 <= local_c0.st_size) {
        if ((long)uVar15 < 0) {
          uVar21 = -uVar15;
          bVar25 = (long)(local_c0.st_size + uVar15) < 0;
          uVar12 = 0;
          if (local_c0.st_size != uVar21 && SBORROW8(local_c0.st_size,uVar21) == bVar25) {
            uVar12 = local_c0.st_size - uVar15;
          }
          if (SBORROW8(local_c0.st_size,uVar21) != bVar25) {
            uVar21 = local_c0.st_size;
          }
        }
        else {
          local_158.capa = local_158.capa + 1;
          iVar13 = fio_atol((char **)&local_158);
          if (iVar13 < 1) goto LAB_00148de4;
          uVar21 = (long)(iVar13 - uVar15) >> 0x3f & uVar15;
          if (local_c0.st_size < iVar13 + 1) {
            uVar21 = uVar15;
          }
          uVar12 = uVar15;
          uVar21 = ((iVar13 - uVar15) - uVar21) + 1;
        }
        h->status = 0xce;
        local_100 = fiobj_str_buf(1);
        fiobj_str_printf(local_100,"bytes %lu-%lu/%lu",uVar15,uVar15 + uVar21 + -1,local_c0.st_size)
        ;
        http_set_header(h,HTTP_HEADER_CONTENT_RANGE,local_100);
        FVar11 = HTTP_HVALUE_BYTES;
        FVar8 = HTTP_HEADER_ACCEPT_RANGES;
        if ((((~(uint)HTTP_HVALUE_BYTES & 6) != 0) && (HTTP_HVALUE_BYTES != 0)) &&
           ((HTTP_HVALUE_BYTES & 1) == 0)) {
          LOCK();
          piVar20 = (int *)((HTTP_HVALUE_BYTES & 0xfffffffffffffff8) + 4);
          *piVar20 = *piVar20 + 1;
          UNLOCK();
        }
        http_set_header(h,FVar8,FVar11);
        goto LAB_00148a71;
      }
    }
LAB_00148de4:
    uVar12 = 0;
  }
  else {
    fiobj_hash_delete2(h->headers,http_sendfile2::range_hash);
    uVar12 = 0;
LAB_00148a71:
    uVar15 = h->method;
    if (uVar15 == 0) {
LAB_00148b75:
      local_178.data = anon_var_dwarf_20c;
      local_178.len._0_4_ = 4;
      goto LAB_00148b88;
    }
    cVar4 = (char)uVar15;
    if ((uVar15 & 1) == 0) {
      switch((uint)uVar15 & 6) {
      case 0:
        cVar4 = *(char *)(uVar15 & 0xfffffffffffffff8);
LAB_00148aa2:
        switch(cVar4) {
        case '\'':
          pfVar9 = &FIOBJECT_VTABLE_FLOAT;
          break;
        case '(':
          goto switchD_00148a97_caseD_2;
        case ')':
          pfVar9 = &FIOBJECT_VTABLE_ARRAY;
          break;
        case '*':
          goto switchD_00148a97_caseD_4;
        case '+':
          pfVar9 = &FIOBJECT_VTABLE_DATA;
          break;
        default:
          pfVar9 = &FIOBJECT_VTABLE_NUMBER;
        }
        break;
      case 2:
switchD_00148a97_caseD_2:
        pfVar9 = &FIOBJECT_VTABLE_STRING;
        break;
      case 4:
switchD_00148a97_caseD_4:
        pfVar9 = &FIOBJECT_VTABLE_HASH;
        break;
      case 6:
        if (cVar4 == '&') {
          local_178.data = anon_var_dwarf_217;
          local_178.len._0_4_ = 5;
        }
        else {
          uVar6 = (uint)uVar15 & 0xff;
          if (uVar6 != 0x16) {
            if (uVar6 == 6) goto LAB_00148b75;
            goto LAB_00148aa2;
          }
          local_178.data = anon_var_dwarf_222;
          local_178.len._0_4_ = 4;
        }
LAB_00148b88:
        local_178.capa._0_4_ = 0;
        local_178.capa._4_4_ = 0;
        local_178.len._4_4_ = 0;
        goto LAB_00148b8d;
      }
      (*pfVar9->to_str)(&local_178,uVar15);
    }
    else {
      fio_ltocstr(&local_178,(long)uVar15 >> 1);
    }
LAB_00148b8d:
    local_198.data = local_178.data;
    local_198.capa = CONCAT44(local_178.capa._4_4_,(undefined4)local_178.capa);
    local_198.len = CONCAT44(local_178.len._4_4_,(undefined4)local_178.len);
    if (local_198.len != 3) {
      if (local_198.len == 4) {
        iVar5 = strncasecmp("head",local_178.data,4);
        FVar7 = HTTP_HEADER_CONTENT_LENGTH;
        if (iVar5 == 0) {
          if ((long)(uVar21 + 0x4000000000000000) < 0) {
            FVar8 = fiobj_num_new_bignum(uVar21);
          }
          else {
            FVar8 = (uVar21 * 2 | uVar21 & 0x8000000000000000) + 1;
          }
          http_set_header(h,FVar7,FVar8);
LAB_0014893e:
          http_finish(h);
          return 0;
        }
      }
      else if ((local_198.len == 7) && (iVar5 = strncasecmp("options",local_178.data,7), iVar5 == 0)
              ) {
        local_f8[1] = 0;
        local_f8[2] = 5;
        local_e0 = "allow";
        local_d8 = 0;
        uStack_d0 = 9;
        local_c8 = "GET, HEAD";
        n.data = "allow";
        n.capa = SUB168(ZEXT816(5) << 0x40,0);
        n.len = SUB168(ZEXT816(5) << 0x40,8);
        v.data = "GET, HEAD";
        v.capa = SUB168(ZEXT816(9) << 0x40,0);
        v.len = SUB168(ZEXT816(9) << 0x40,8);
        http_set_header2(h,n,v);
        h->status = 200;
        http_finish(h);
        return 0;
      }
LAB_00148ced:
      http_send_error(h,0x193);
      return 0;
    }
    iVar5 = strncasecmp("get",local_178.data,3);
    if (iVar5 != 0) goto LAB_00148ced;
  }
  if (FVar7 == 0) {
LAB_00148f01:
    local_178.data = anon_var_dwarf_20c;
    local_178.len._0_4_ = 4;
    goto LAB_00148f14;
  }
  if ((FVar7 & 1) != 0) {
    fio_ltocstr(&local_178,lVar17);
    goto LAB_00148f19;
  }
  switch(uVar23 & 6) {
  case 0:
    cVar22 = *(char *)(FVar7 & 0xfffffffffffffff8);
LAB_00148e15:
    switch(cVar22) {
    case '\'':
      pfVar9 = &FIOBJECT_VTABLE_FLOAT;
      break;
    case '(':
      goto switchD_00148e0a_caseD_2;
    case ')':
      pfVar9 = &FIOBJECT_VTABLE_ARRAY;
      break;
    case '*':
      goto switchD_00148e0a_caseD_4;
    case '+':
      pfVar9 = &FIOBJECT_VTABLE_DATA;
      break;
    default:
      pfVar9 = &FIOBJECT_VTABLE_NUMBER;
    }
    break;
  case 2:
switchD_00148e0a_caseD_2:
    pfVar9 = &FIOBJECT_VTABLE_STRING;
    break;
  case 4:
switchD_00148e0a_caseD_4:
    pfVar9 = &FIOBJECT_VTABLE_HASH;
    break;
  case 6:
    if (cVar22 == '&') {
      local_178.data = anon_var_dwarf_217;
      local_178.len._0_4_ = 5;
    }
    else {
      if ((uVar23 & 0xff) != 0x16) {
        if ((uVar23 & 0xff) == 6) goto LAB_00148f01;
        goto LAB_00148e15;
      }
      local_178.data = anon_var_dwarf_222;
      local_178.len._0_4_ = 4;
    }
LAB_00148f14:
    local_178.capa._0_4_ = 0;
    local_178.capa._4_4_ = 0;
    local_178.len._4_4_ = 0;
    goto LAB_00148f19;
  }
  (*pfVar9->to_str)(&local_178,FVar7);
LAB_00148f19:
  local_198.data = local_178.data;
  local_198.capa = CONCAT44(local_178.capa._4_4_,(undefined4)local_178.capa);
  local_198.len = CONCAT44(local_178.len._4_4_,(undefined4)local_178.len);
  iVar5 = open(local_178.data,0);
  FVar8 = HTTP_HVALUE_GZIP;
  FVar7 = HTTP_HEADER_CONTENT_ENCODING;
  if (iVar5 == -1) {
    http_sendfile2_cold_1();
    return 0;
  }
  if (bVar3) {
    lVar17 = 0;
    do {
      lVar14 = lVar17;
      if (1 - local_198.len == lVar14) break;
      lVar17 = lVar14 + -1;
    } while (*(char *)((long)local_198.data + lVar14 + (local_198.len - 1)) != '.');
    pcVar19 = (char *)((long)local_198.data + lVar14 + local_198.len);
    sVar10 = -lVar14;
  }
  else {
    if ((((~(uint)HTTP_HVALUE_GZIP & 6) != 0) && (HTTP_HVALUE_GZIP != 0)) &&
       ((HTTP_HVALUE_GZIP & 1) == 0)) {
      LOCK();
      piVar20 = (int *)((HTTP_HVALUE_GZIP & 0xfffffffffffffff8) + 4);
      *piVar20 = *piVar20 + 1;
      UNLOCK();
    }
    http_set_header(h,FVar7,FVar8);
    for (uVar15 = local_198.len - 4; uVar15 != 0; uVar15 = uVar15 - 1) {
      if (*(char *)((long)local_198.data + uVar15) == '.') goto LAB_00148fd7;
    }
    uVar15 = 0;
LAB_00148fd7:
    pcVar19 = (char *)((long)local_198.data + uVar15 + 1);
    sVar10 = (local_198.len + ~uVar15) - 3;
  }
  FVar7 = http_mimetype_find(pcVar19,sVar10);
  if (FVar7 != 0) {
    http_set_header(h,HTTP_HEADER_CONTENT_TYPE,FVar7);
  }
  http_sendfile(h,iVar5,uVar21,uVar12);
  return 0;
}

Assistant:

int http_sendfile2(http_s *h, const char *prefix, size_t prefix_len,
                   const char *encoded, size_t encoded_len) {
  if (HTTP_INVALID_HANDLE(h))
    return -1;
  struct stat file_data = {.st_size = 0};
  static uint64_t accept_enc_hash = 0;
  if (!accept_enc_hash)
    accept_enc_hash = fiobj_hash_string("accept-encoding", 15);
  static uint64_t range_hash = 0;
  if (!range_hash)
    range_hash = fiobj_hash_string("range", 5);

  /* create filename string */
  FIOBJ filename = fiobj_str_tmp();
  if (prefix && prefix_len) {
    /* start with prefix path */
    if (encoded && prefix[prefix_len - 1] == '/' && encoded[0] == '/')
      --prefix_len;
    fiobj_str_capa_assert(filename, prefix_len + encoded_len + 4);
    fiobj_str_write(filename, prefix, prefix_len);
  }
  {
    /* decode filename in cases where it's URL encoded */
    fio_str_info_s tmp = fiobj_obj2cstr(filename);
    if (encoded) {
      char *pos = (char *)encoded;
      const char *end = encoded + encoded_len;
      while (pos < end) {
        if (*pos == '%') {
          // decode hex value (this is a percent encoded value).
          if (hex2byte((uint8_t *)tmp.data + tmp.len, (uint8_t *)pos + 1))
            return -1;
          tmp.len++;
          pos += 3;
        } else
          tmp.data[tmp.len++] = *(pos++);
      }
      tmp.data[tmp.len] = 0;
      fiobj_str_resize(filename, tmp.len);
      /* test for path manipulations after decoding */
      if (http_test_encoded_path(tmp.data + prefix_len, tmp.len - prefix_len))
        return -1;
    }
    if (tmp.data[tmp.len - 1] == '/')
      fiobj_str_write(filename, "index.html", 10);
  }
  /* test for file existance  */

  int file = -1;
  uint8_t is_gz = 0;

  fio_str_info_s s = fiobj_obj2cstr(filename);
  {
    FIOBJ tmp = fiobj_hash_get2(h->headers, accept_enc_hash);
    if (!tmp)
      goto no_gzip_support;
    fio_str_info_s ac_str = fiobj_obj2cstr(tmp);
    if (!ac_str.data || !strstr(ac_str.data, "gzip"))
      goto no_gzip_support;
    if (s.data[s.len - 3] != '.' || s.data[s.len - 2] != 'g' ||
        s.data[s.len - 1] != 'z') {
      fiobj_str_write(filename, ".gz", 3);
      s = fiobj_obj2cstr(filename);
      if (!stat(s.data, &file_data) &&
          (S_ISREG(file_data.st_mode) || S_ISLNK(file_data.st_mode))) {
        is_gz = 1;
        goto found_file;
      }
      fiobj_str_resize(filename, s.len - 3);
    }
  }
no_gzip_support:
  if (stat(s.data, &file_data) ||
      !(S_ISREG(file_data.st_mode) || S_ISLNK(file_data.st_mode)))
    return -1;
found_file:
  /* set last-modified */
  {
    FIOBJ tmp = fiobj_str_buf(32);
    fiobj_str_resize(
        tmp, http_time2str(fiobj_obj2cstr(tmp).data, file_data.st_mtime));
    http_set_header(h, HTTP_HEADER_LAST_MODIFIED, tmp);
  }
  /* set cache-control */
  http_set_header(h, HTTP_HEADER_CACHE_CONTROL, fiobj_dup(HTTP_HVALUE_MAX_AGE));
  /* set & test etag */
  uint64_t etag = (uint64_t)file_data.st_size;
  etag ^= (uint64_t)file_data.st_mtime;
  etag = fiobj_hash_string(&etag, sizeof(uint64_t));
  FIOBJ etag_str = fiobj_str_buf(32);
  fiobj_str_resize(etag_str,
                   fio_base64_encode(fiobj_obj2cstr(etag_str).data,
                                     (void *)&etag, sizeof(uint64_t)));
  /* set */
  http_set_header(h, HTTP_HEADER_ETAG, etag_str);
  /* test */
  {
    static uint64_t none_match_hash = 0;
    if (!none_match_hash)
      none_match_hash = fiobj_hash_string("if-none-match", 13);
    FIOBJ tmp2 = fiobj_hash_get2(h->headers, none_match_hash);
    if (tmp2 && fiobj_iseq(tmp2, etag_str)) {
      h->status = 304;
      http_finish(h);
      return 0;
    }
  }
  /* handle range requests */
  int64_t offset = 0;
  int64_t length = file_data.st_size;
  {
    static uint64_t ifrange_hash = 0;
    if (!ifrange_hash)
      ifrange_hash = fiobj_hash_string("if-range", 8);
    FIOBJ tmp = fiobj_hash_get2(h->headers, ifrange_hash);
    if (tmp && fiobj_iseq(tmp, etag_str)) {
      fiobj_hash_delete2(h->headers, range_hash);
    } else {
      tmp = fiobj_hash_get2(h->headers, range_hash);
      if (tmp) {
        /* range ahead... */
        if (FIOBJ_TYPE_IS(tmp, FIOBJ_T_ARRAY))
          tmp = fiobj_ary_index(tmp, 0);
        fio_str_info_s range = fiobj_obj2cstr(tmp);
        if (!range.data || memcmp("bytes=", range.data, 6))
          goto open_file;
        char *pos = range.data + 6;
        int64_t start_at = 0, end_at = 0;
        start_at = fio_atol(&pos);
        if (start_at >= file_data.st_size)
          goto open_file;
        if (start_at >= 0) {
          pos++;
          end_at = fio_atol(&pos);
          if (end_at <= 0)
            goto open_file;
        }
        /* we ignore multimple ranges, only responding with the first range. */
        if (start_at < 0) {
          if (0 - start_at < file_data.st_size) {
            offset = file_data.st_size - start_at;
            length = 0 - start_at;
          }
        } else if (end_at) {
          offset = start_at;
          length = end_at - start_at + 1;
          if (length + start_at > file_data.st_size || length <= 0)
            length = length - start_at;
        } else {
          offset = start_at;
          length = length - start_at;
        }
        h->status = 206;

        {
          FIOBJ cranges = fiobj_str_buf(1);
          fiobj_str_printf(cranges, "bytes %lu-%lu/%lu",
                           (unsigned long)start_at,
                           (unsigned long)(start_at + length - 1),
                           (unsigned long)file_data.st_size);
          http_set_header(h, HTTP_HEADER_CONTENT_RANGE, cranges);
        }
        http_set_header(h, HTTP_HEADER_ACCEPT_RANGES,
                        fiobj_dup(HTTP_HVALUE_BYTES));
      }
    }
  }
  /* test for an OPTIONS request or invalid methods */
  s = fiobj_obj2cstr(h->method);
  switch (s.len) {
  case 7:
    if (!strncasecmp("options", s.data, 7)) {
      http_set_header2(h, (fio_str_info_s){.data = (char *)"allow", .len = 5},
                       (fio_str_info_s){.data = (char *)"GET, HEAD", .len = 9});
      h->status = 200;
      http_finish(h);
      return 0;
    }
    break;
  case 3:
    if (!strncasecmp("get", s.data, 3))
      goto open_file;
    break;
  case 4:
    if (!strncasecmp("head", s.data, 4)) {
      http_set_header(h, HTTP_HEADER_CONTENT_LENGTH, fiobj_num_new(length));
      http_finish(h);
      return 0;
    }
    break;
  }
  http_send_error(h, 403);
  return 0;
open_file:
  s = fiobj_obj2cstr(filename);
  file = open(s.data, O_RDONLY);
  if (file == -1) {
    FIO_LOG_ERROR("(HTTP) couldn't open file %s!\n", s.data);
    perror("     ");
    http_send_error(h, 500);
    return 0;
  }
  {
    FIOBJ tmp = 0;
    uintptr_t pos = 0;
    if (is_gz) {
      http_set_header(h, HTTP_HEADER_CONTENT_ENCODING,
                      fiobj_dup(HTTP_HVALUE_GZIP));

      pos = s.len - 4;
      while (pos && s.data[pos] != '.')
        pos--;
      pos++; /* assuming, but that's fine. */
      tmp = http_mimetype_find(s.data + pos, s.len - pos - 3);

    } else {
      pos = s.len - 1;
      while (pos && s.data[pos] != '.')
        pos--;
      pos++; /* assuming, but that's fine. */
      tmp = http_mimetype_find(s.data + pos, s.len - pos);
    }
    if (tmp)
      http_set_header(h, HTTP_HEADER_CONTENT_TYPE, tmp);
  }
  http_sendfile(h, file, length, offset);
  return 0;
}